

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O1

void QtPrivate::BindableWarnings::printUnsuitableBindableWarning
               (QAnyStringView prefix,Reason reason)

{
  undefined8 uVar1;
  storage_type *in_RCX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this;
  long in_FS_OFFSET;
  QAnyStringView string;
  QByteArrayView ba;
  QAnyStringView string_00;
  QByteArrayView ba_00;
  QAnyStringView string_01;
  QByteArrayView ba_01;
  QString local_80;
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined4 local_54;
  char *local_50;
  undefined1 local_48 [32];
  long local_28;
  
  aVar2 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)prefix.m_size;
  this = prefix.field_0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lcQPropertyBinding();
  if (reason == ReadOnlyInterface) {
    if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        == 0) goto LAB_002c4a25;
    local_68 = 2;
    local_64 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = lcQPropertyBinding::category.name;
    QMessageLogger::warning((QMessageLogger *)local_48);
    *(bool *)(local_48._0_8_ + 0x31) = true;
    string_00.m_size = (size_t)in_RCX;
    string_00.field_0.m_data = aVar2.m_data;
    convertToQString(&local_80,(QtPrivate *)this.m_data_utf8,string_00);
    if ((QChar *)local_80.d.ptr == (QChar *)0x0) {
      local_80.d.ptr = L"";
    }
    QDebug::putString((QDebug *)local_48,(QChar *)local_80.d.ptr,local_80.d.size);
    if (*(bool *)(local_48._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    uVar1 = local_48._0_8_;
    ba_00.m_data = in_RCX;
    ba_00.m_size = (qsizetype)"The QBindable is read-only.";
    QString::fromUtf8((QString *)(local_48 + 8),(QString *)0x1b,ba_00);
    ::QTextStream::operator<<((QTextStream *)uVar1,(QString *)(local_48 + 8));
    if ((QArrayData *)local_48._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_48._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
  }
  else if (reason == NonBindableInterface) {
    if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        == 0) goto LAB_002c4a25;
    local_68 = 2;
    local_64 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = lcQPropertyBinding::category.name;
    QMessageLogger::warning((QMessageLogger *)local_48);
    *(bool *)(local_48._0_8_ + 0x31) = true;
    string.m_size = (size_t)in_RCX;
    string.field_0.m_data = aVar2.m_data;
    convertToQString(&local_80,(QtPrivate *)this.m_data_utf8,string);
    if ((QChar *)local_80.d.ptr == (QChar *)0x0) {
      local_80.d.ptr = L"";
    }
    QDebug::putString((QDebug *)local_48,(QChar *)local_80.d.ptr,local_80.d.size);
    if (*(bool *)(local_48._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    uVar1 = local_48._0_8_;
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"The QBindable does not allow interaction with the binding.";
    QString::fromUtf8((QString *)(local_48 + 8),(QString *)0x3a,ba);
    ::QTextStream::operator<<((QTextStream *)uVar1,(QString *)(local_48 + 8));
    if ((QArrayData *)local_48._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_48._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
  }
  else {
    if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        == 0) goto LAB_002c4a25;
    local_68 = 2;
    local_64 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = lcQPropertyBinding::category.name;
    QMessageLogger::warning((QMessageLogger *)local_48);
    *(bool *)(local_48._0_8_ + 0x31) = true;
    string_01.m_size = (size_t)in_RCX;
    string_01.field_0.m_data = aVar2.m_data;
    convertToQString(&local_80,(QtPrivate *)this.m_data_utf8,string_01);
    if ((QChar *)local_80.d.ptr == (QChar *)0x0) {
      local_80.d.ptr = L"";
    }
    QDebug::putString((QDebug *)local_48,(QChar *)local_80.d.ptr,local_80.d.size);
    if (*(bool *)(local_48._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
    uVar1 = local_48._0_8_;
    ba_01.m_data = in_RCX;
    ba_01.m_size = (qsizetype)"The QBindable is invalid.";
    QString::fromUtf8((QString *)(local_48 + 8),(QString *)0x19,ba_01);
    ::QTextStream::operator<<((QTextStream *)uVar1,(QString *)(local_48 + 8));
    if ((QArrayData *)local_48._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_48._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_48._8_8_,2,0x10);
      }
    }
    if (*(bool *)(local_48._0_8_ + 0x30) == true) {
      ::QTextStream::operator<<((QTextStream *)local_48._0_8_,' ');
    }
  }
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
    }
  }
  QDebug::~QDebug((QDebug *)local_48);
LAB_002c4a25:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void printUnsuitableBindableWarning(QAnyStringView prefix, BindableWarnings::Reason reason)
{
    switch (reason) {
    case QtPrivate::BindableWarnings::NonBindableInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable does not allow interaction with the binding.";
        break;
    case QtPrivate::BindableWarnings::ReadOnlyInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable is read-only.";
        break;
    default:
    case QtPrivate::BindableWarnings::InvalidInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable is invalid.";
        break;
    }
}